

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdshemu_x86.c
# Opt level: O0

ND_UINT64 ShemuX86GetGprValue(SHEMU_CONTEXT *Context,ND_UINT32 Reg,ND_UINT32 Size,ND_BOOL High8)

{
  ND_UINT32 NStack_1c;
  ND_BOOL High8_local;
  ND_UINT32 Size_local;
  ND_UINT32 Reg_local;
  SHEMU_CONTEXT *Context_local;
  
  NStack_1c = Reg;
  if ((High8 != '\0') && (3 < Reg)) {
    NStack_1c = Reg - 4;
  }
  if (((Context->Icache).Icache[(ulong)NStack_1c - 0x30] & 2) == 0) {
    (Context->Icache).Icache[(ulong)NStack_1c - 0x30] =
         (Context->Icache).Icache[(ulong)NStack_1c - 0x30] | 1;
  }
  if (Size == 1) {
    if (High8 == '\0') {
      Context_local =
           (SHEMU_CONTEXT *)(*(ulong *)((long)&Context->Arch + (ulong)NStack_1c * 8 + 0x1e8) & 0xff)
      ;
    }
    else {
      Context_local =
           (SHEMU_CONTEXT *)
           (*(ulong *)((long)&Context->Arch + (ulong)NStack_1c * 8 + 0x1e8) >> 8 & 0xff);
    }
  }
  else if (Size == 2) {
    Context_local =
         (SHEMU_CONTEXT *)(*(ulong *)((long)&Context->Arch + (ulong)NStack_1c * 8 + 0x1e8) & 0xffff)
    ;
  }
  else if (Size == 4) {
    Context_local =
         (SHEMU_CONTEXT *)
         (*(ulong *)((long)&Context->Arch + (ulong)NStack_1c * 8 + 0x1e8) & 0xffffffff);
  }
  else {
    Context_local = *(SHEMU_CONTEXT **)((long)&Context->Arch + (ulong)NStack_1c * 8 + 0x1e8);
  }
  return (ND_UINT64)Context_local;
}

Assistant:

static ND_UINT64
ShemuX86GetGprValue(
    SHEMU_CONTEXT *Context,
    ND_UINT32 Reg,
    ND_UINT32 Size,
    ND_BOOL High8
    )
{
    if (High8 && Reg >= 4)
    {
        Reg = Reg - 4;
    }

    // Any read of the GPR, before being modified, counts as being "saved". The reason here is that we cannot
    // easily track a proper save in memory, as the register may be copied in another register, and only then
    // saved.
    if (!(Context->Arch.X86.GprTracker[Reg] & GPR_TRACK_DIRTY))
    {
        Context->Arch.X86.GprTracker[Reg] |= GPR_TRACK_READ;
    }

    switch (Size)
    {
    case 1:
        if (High8)
        {
            // AH, CH, DH or BH accessed.
            return (*(&Context->Arch.X86.Registers.RegRax + Reg) >> 8) & 0xff;
        }
        else
        {
            return *(&Context->Arch.X86.Registers.RegRax + Reg) & 0xff;
        }

    case 2:
        return *(&Context->Arch.X86.Registers.RegRax + Reg) & 0xffff;

    case 4:
        return *(&Context->Arch.X86.Registers.RegRax + Reg) & 0xffffffff;

    default:
        return *(&Context->Arch.X86.Registers.RegRax + Reg);
    }
}